

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.h
# Opt level: O1

void __thiscall
GdlCondExpression::GdlCondExpression
          (GdlCondExpression *this,GdlExpression *pexpTest,GdlExpression *pexpTrue,
          GdlExpression *pexpFalse)

{
  GdlObject *this_00;
  GdlExpression *pGVar1;
  
  this_00 = &(this->super_GdlExpression).super_GdlObject;
  GdlObject::GdlObject(this_00);
  (this->super_GdlExpression).m_exptResult = kexptUnknown;
  (this->super_GdlExpression)._vptr_GdlExpression = (_func_int **)&PTR_Clone_002424f8;
  this->m_pexpTest = pexpTest;
  this->m_pexpTrue = pexpTrue;
  this->m_pexpFalse = pexpFalse;
  if ((pexpTest != (GdlExpression *)0x0) && ((pexpTest->super_GdlObject).m_lnf.m_nLinePre == 0)) {
    (*pexpTest->_vptr_GdlExpression[4])(pexpTest,this_00);
  }
  pGVar1 = this->m_pexpTrue;
  if ((pGVar1 != (GdlExpression *)0x0) && ((pGVar1->super_GdlObject).m_lnf.m_nLinePre == 0)) {
    (*pGVar1->_vptr_GdlExpression[4])(pGVar1,this_00);
  }
  pGVar1 = this->m_pexpFalse;
  if ((pGVar1 != (GdlExpression *)0x0) && ((pGVar1->super_GdlObject).m_lnf.m_nLinePre == 0)) {
    (*pGVar1->_vptr_GdlExpression[4])(pGVar1,this_00);
  }
  return;
}

Assistant:

GdlCondExpression(
		GdlExpression* pexpTest,
		GdlExpression * pexpTrue,
		GdlExpression * pexpFalse)
		:	GdlExpression(),
			m_pexpTest(pexpTest),
			m_pexpTrue(pexpTrue),
			m_pexpFalse(pexpFalse)
	{
//		m_pexpTest->SetType(kexptBoolean);
		if (m_pexpTest && m_pexpTest->LineIsZero())
			m_pexpTest->PropagateLineAndFile(m_lnf);
		if (m_pexpTrue && m_pexpTrue->LineIsZero())
			m_pexpTrue->PropagateLineAndFile(m_lnf);
		if (m_pexpFalse && m_pexpFalse->LineIsZero())
			m_pexpFalse->PropagateLineAndFile(m_lnf);
	}